

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void luaD_growstack(lua_State *L,int n)

{
  int iVar1;
  int local_20;
  int newsize;
  int needed;
  int size;
  int n_local;
  lua_State *L_local;
  
  if (1000000 < L->stacksize) {
    luaD_throw(L,6);
  }
  iVar1 = (int)((long)L->top - (long)L->stack >> 4) + n + 5;
  local_20 = L->stacksize << 1;
  if (1000000 < local_20) {
    local_20 = 1000000;
  }
  if (local_20 < iVar1) {
    local_20 = iVar1;
  }
  if (1000000 < local_20) {
    luaD_reallocstack(L,0xf4308);
    luaG_runerror(L,"stack overflow");
  }
  luaD_reallocstack(L,local_20);
  return;
}

Assistant:

void luaD_growstack(lua_State *L, int n) {
    int size = L->stacksize;
    if (size > LUAI_MAXSTACK)  /* error after extra size? */
        luaD_throw(L, LUA_ERRERR);
    else {
        int needed = cast_int(L->top - L->stack) + n + EXTRA_STACK;
        int newsize = 2 * size;
        if (newsize > LUAI_MAXSTACK) newsize = LUAI_MAXSTACK;
        if (newsize < needed) newsize = needed;
        if (newsize > LUAI_MAXSTACK) {  /* stack overflow? */
            luaD_reallocstack(L, ERRORSTACKSIZE);
            luaG_runerror(L, "stack overflow");
        } else
            luaD_reallocstack(L, newsize);
    }
}